

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O0

void __thiscall
sptk::SymmetricMatrix::SymmetricMatrix(SymmetricMatrix *this,SymmetricMatrix *matrix)

{
  vector<double_*,_std::allocator<double_*>_> *this_00;
  reference pvVar1;
  reference ppdVar2;
  allocator_type *__n;
  vector<double,_std::allocator<double>_> *in_RSI;
  allocator_type *in_RDI;
  int j;
  int i;
  int local_2c;
  int local_28;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffe8;
  
  *(undefined ***)in_RDI = &PTR__SymmetricMatrix_0013bb80;
  *(undefined4 *)(in_RDI + 8) =
       *(undefined4 *)
        &(in_RSI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  std::vector<double,_std::allocator<double>_>::vector(in_RSI,in_stack_ffffffffffffffe8);
  __n = in_RDI + 0x28;
  this_00 = (vector<double_*,_std::allocator<double_*>_> *)(long)*(int *)(in_RDI + 8);
  std::allocator<double_*>::allocator((allocator<double_*> *)0x11789d);
  std::vector<double_*,_std::allocator<double_*>_>::vector(this_00,(size_type)__n,in_RDI);
  std::allocator<double_*>::~allocator((allocator<double_*> *)0x1178bd);
  local_28 = 0;
  local_2c = 0;
  while (local_28 < *(int *)(in_RDI + 8)) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),(long)local_2c);
    ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                        ((vector<double_*,_std::allocator<double_*>_> *)(in_RDI + 0x28),
                         (long)local_28);
    *ppdVar2 = pvVar1;
    local_28 = local_28 + 1;
    local_2c = local_28 + local_2c;
  }
  return;
}

Assistant:

SymmetricMatrix::SymmetricMatrix(const SymmetricMatrix& matrix)
    : num_dimension_(matrix.num_dimension_),
      data_(matrix.data_),
      index_(num_dimension_) {
  for (int i(0), j(0); i < num_dimension_; ++i, j += i) {
    index_[i] = &data_[j];
  }
}